

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unit.cpp
# Opt level: O2

void __thiscall Refal2::CUnit::Print(CUnit *this,ostream *outputStream,CPrintHelper *printHelper)

{
  TUnitType TVar1;
  ostream *poVar2;
  char *pcVar3;
  
  TVar1 = this->type;
  switch(TVar1) {
  case UT_Char:
    poVar2 = std::operator<<(outputStream,"\'");
    outputStream = std::operator<<(poVar2,(this->field_1).c);
    pcVar3 = "\' ";
    break;
  case UT_Label:
    std::operator<<(outputStream,"/");
    (*printHelper->_vptr_CPrintHelper[1])(printHelper,outputStream,(ulong)(this->field_1).number);
    pcVar3 = "/ ";
    break;
  case UT_Label|UT_Char:
  case UT_Number|UT_Char:
  case UT_Number|UT_Label:
  case UT_Number|UT_Label|UT_Char:
switchD_0013554c_caseD_3:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Unit.cpp"
                  ,0x59,"void Refal2::CUnit::Print(std::ostream &, const CPrintHelper &) const");
  case UT_Number:
    poVar2 = std::operator<<(outputStream,"/");
    outputStream = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    pcVar3 = "/ ";
    break;
  case UT_Variable:
    (**printHelper->_vptr_CPrintHelper)(printHelper,outputStream,(ulong)(this->field_1).number);
    pcVar3 = " ";
    break;
  default:
    if (TVar1 == UT_LeftParen) {
      pcVar3 = "( ";
    }
    else if (TVar1 == UT_RightParen) {
      pcVar3 = ") ";
    }
    else if (TVar1 == UT_LeftBracket) {
      pcVar3 = "< ";
    }
    else {
      if (TVar1 != UT_RightBracket) goto switchD_0013554c_caseD_3;
      pcVar3 = "> ";
    }
  }
  std::operator<<(outputStream,pcVar3);
  return;
}

Assistant:

void CUnit::Print( std::ostream& outputStream,
	const CPrintHelper& printHelper ) const
{
	switch( GetType() ) {
		case UT_Char:
			outputStream << "'" << Char() << "' ";
			break;
		case UT_Label:
			outputStream << "/";
			printHelper.Label( outputStream, Label() );
			outputStream << "/ ";
			break;
		case UT_Number:
			outputStream << "/" << Number() << "/ ";
			break;
		case UT_Variable:
			printHelper.Variable( outputStream, Variable() );
			outputStream << " ";
			break;
		case UT_LeftParen:
			outputStream << "( ";
			break;
		case UT_RightParen:
			outputStream << ") ";
			break;
		case UT_LeftBracket:
			outputStream << "< ";
			break;
		case UT_RightBracket:
			outputStream << "> ";
			break;
		default:
			assert( false );
			break;
	}
}